

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O2

void __thiscall
perfetto::TracingServiceImpl::ScrapeSharedMemoryBuffers
          (TracingServiceImpl *this,TracingSession *tracing_session,ProducerEndpointImpl *producer)

{
  ushort uVar1;
  WriterID writer_id;
  uint32_t page_layout;
  unsigned_short *puVar2;
  bool bVar3;
  uint32_t uVar4;
  __normal_iterator<const_unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
  _Var5;
  uint32_t chunk_idx;
  ushort num_fragments;
  long lVar6;
  ulong uVar7;
  uint uVar8;
  long lVar9;
  byte bVar10;
  __normal_iterator<const_unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
  _Var11;
  Optional<unsigned_short> target_buffer_id;
  Chunk chunk;
  
  if (producer->smb_scraping_enabled_ != true) {
    return;
  }
  if ((producer->writers_)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
    return;
  }
  _Var5._M_current =
       (tracing_session->buffers_index).
       super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
       super__Vector_impl_data._M_start;
  puVar2 = (tracing_session->buffers_index).
           super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
           super__Vector_impl_data._M_finish;
  lVar9 = (long)puVar2 - (long)_Var5._M_current;
  chunk.begin_ = (uint8_t *)producer;
  for (lVar6 = lVar9 >> 3; _Var11._M_current = _Var5._M_current, 0 < lVar6; lVar6 = lVar6 + -1) {
    bVar3 = __gnu_cxx::__ops::
            _Iter_pred<perfetto::TracingServiceImpl::ScrapeSharedMemoryBuffers(perfetto::TracingServiceImpl::TracingSession*,perfetto::TracingServiceImpl::ProducerEndpointImpl*)::$_0>
            ::operator()((_Iter_pred<perfetto::TracingServiceImpl::ScrapeSharedMemoryBuffers(perfetto::TracingServiceImpl::TracingSession*,perfetto::TracingServiceImpl::ProducerEndpointImpl*)::__0>
                          *)&chunk,_Var5);
    if (bVar3) goto LAB_002f7497;
    bVar3 = __gnu_cxx::__ops::
            _Iter_pred<perfetto::TracingServiceImpl::ScrapeSharedMemoryBuffers(perfetto::TracingServiceImpl::TracingSession*,perfetto::TracingServiceImpl::ProducerEndpointImpl*)::$_0>
            ::operator()((_Iter_pred<perfetto::TracingServiceImpl::ScrapeSharedMemoryBuffers(perfetto::TracingServiceImpl::TracingSession*,perfetto::TracingServiceImpl::ProducerEndpointImpl*)::__0>
                          *)&chunk,
                         (__normal_iterator<const_unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
                          )(_Var5._M_current + 1));
    _Var11._M_current = _Var5._M_current + 1;
    if (bVar3) goto LAB_002f7497;
    bVar3 = __gnu_cxx::__ops::
            _Iter_pred<perfetto::TracingServiceImpl::ScrapeSharedMemoryBuffers(perfetto::TracingServiceImpl::TracingSession*,perfetto::TracingServiceImpl::ProducerEndpointImpl*)::$_0>
            ::operator()((_Iter_pred<perfetto::TracingServiceImpl::ScrapeSharedMemoryBuffers(perfetto::TracingServiceImpl::TracingSession*,perfetto::TracingServiceImpl::ProducerEndpointImpl*)::__0>
                          *)&chunk,
                         (__normal_iterator<const_unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
                          )(_Var5._M_current + 2));
    _Var11._M_current = _Var5._M_current + 2;
    if (bVar3) goto LAB_002f7497;
    bVar3 = __gnu_cxx::__ops::
            _Iter_pred<perfetto::TracingServiceImpl::ScrapeSharedMemoryBuffers(perfetto::TracingServiceImpl::TracingSession*,perfetto::TracingServiceImpl::ProducerEndpointImpl*)::$_0>
            ::operator()((_Iter_pred<perfetto::TracingServiceImpl::ScrapeSharedMemoryBuffers(perfetto::TracingServiceImpl::TracingSession*,perfetto::TracingServiceImpl::ProducerEndpointImpl*)::__0>
                          *)&chunk,
                         (__normal_iterator<const_unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
                          )(_Var5._M_current + 3));
    _Var11._M_current = _Var5._M_current + 3;
    if (bVar3) goto LAB_002f7497;
    _Var5._M_current = _Var5._M_current + 4;
    lVar9 = lVar9 + -8;
  }
  lVar9 = lVar9 >> 1;
  if (lVar9 != 1) {
    if (lVar9 != 2) {
      if (lVar9 != 3) {
        return;
      }
      bVar3 = __gnu_cxx::__ops::
              _Iter_pred<perfetto::TracingServiceImpl::ScrapeSharedMemoryBuffers(perfetto::TracingServiceImpl::TracingSession*,perfetto::TracingServiceImpl::ProducerEndpointImpl*)::$_0>
              ::operator()((_Iter_pred<perfetto::TracingServiceImpl::ScrapeSharedMemoryBuffers(perfetto::TracingServiceImpl::TracingSession*,perfetto::TracingServiceImpl::ProducerEndpointImpl*)::__0>
                            *)&chunk,_Var5);
      if (bVar3) goto LAB_002f7497;
      _Var5._M_current = _Var5._M_current + 1;
    }
    bVar3 = __gnu_cxx::__ops::
            _Iter_pred<perfetto::TracingServiceImpl::ScrapeSharedMemoryBuffers(perfetto::TracingServiceImpl::TracingSession*,perfetto::TracingServiceImpl::ProducerEndpointImpl*)::$_0>
            ::operator()((_Iter_pred<perfetto::TracingServiceImpl::ScrapeSharedMemoryBuffers(perfetto::TracingServiceImpl::TracingSession*,perfetto::TracingServiceImpl::ProducerEndpointImpl*)::__0>
                          *)&chunk,_Var5);
    _Var11._M_current = _Var5._M_current;
    if (bVar3) goto LAB_002f7497;
    _Var5._M_current = _Var5._M_current + 1;
  }
  bVar3 = __gnu_cxx::__ops::
          _Iter_pred<perfetto::TracingServiceImpl::ScrapeSharedMemoryBuffers(perfetto::TracingServiceImpl::TracingSession*,perfetto::TracingServiceImpl::ProducerEndpointImpl*)::$_0>
          ::operator()((_Iter_pred<perfetto::TracingServiceImpl::ScrapeSharedMemoryBuffers(perfetto::TracingServiceImpl::TracingSession*,perfetto::TracingServiceImpl::ProducerEndpointImpl*)::__0>
                        *)&chunk,_Var5);
  _Var11._M_current = _Var5._M_current;
  if (!bVar3) {
    _Var11._M_current = puVar2;
  }
LAB_002f7497:
  if (_Var11._M_current != puVar2) {
    for (uVar7 = 0; uVar7 < (producer->shmem_abi_).num_pages_; uVar7 = uVar7 + 1) {
      page_layout = *(uint32_t *)
                     ((producer->shmem_abi_).start_ + (producer->shmem_abi_).page_size_ * uVar7);
      uVar4 = SharedMemoryABI::GetUsedChunks(page_layout);
      if (uVar4 != 0) {
        bVar10 = 0;
        for (; uVar4 != 0; uVar4 = uVar4 >> 1) {
          if ((uVar4 & 1) != 0) {
            uVar8 = page_layout >> (bVar10 & 0x1f) & 3;
            SharedMemoryABI::GetChunkUnchecked
                      ((SharedMemoryABI *)&chunk,(size_t)&producer->shmem_abi_,(uint32_t)uVar7,
                       (ulong)page_layout);
            uVar1 = *(ushort *)(chunk.begin_ + 6);
            num_fragments = uVar1 & 0x3ff;
            if ((uVar8 == 3) || (1 < num_fragments)) {
              writer_id = *(WriterID *)(chunk.begin_ + 4);
              ProducerEndpointImpl::buffer_id_for_writer
                        ((ProducerEndpointImpl *)&target_buffer_id,(WriterID)producer);
              if ((target_buffer_id.super_OptionalBase<unsigned_short>.storage_.
                   super_OptionalStorageBase<unsigned_short,_true>.is_populated_ == true) &&
                 (_Var5 = ::std::
                          __find_if<__gnu_cxx::__normal_iterator<unsigned_short_const*,std::vector<unsigned_short,std::allocator<unsigned_short>>>,__gnu_cxx::__ops::_Iter_equals_val<unsigned_short_const>>
                                    ((tracing_session->buffers_index).
                                     super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                     ._M_impl.super__Vector_impl_data._M_start,
                                     (tracing_session->buffers_index).
                                     super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                     ._M_impl.super__Vector_impl_data._M_finish,
                                     &target_buffer_id.super_OptionalBase<unsigned_short>.storage_.
                                      super_OptionalStorageBase<unsigned_short,_true>.field_1),
                 _Var5._M_current !=
                 (tracing_session->buffers_index).
                 super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                 super__Vector_impl_data._M_finish)) {
                CopyProducerPageIntoLogBuffer
                          (this,producer->id_,producer->uid_,producer->pid_,writer_id,
                           *(ChunkID *)chunk.begin_,
                           target_buffer_id.super_OptionalBase<unsigned_short>.storage_.
                           super_OptionalStorageBase<unsigned_short,_true>.field_1.value_,
                           num_fragments,(byte)(uVar1 >> 10),uVar8 == 3,chunk.begin_ + 8,
                           (ulong)chunk.size_ - 8);
              }
            }
          }
          bVar10 = bVar10 + 2;
        }
      }
    }
  }
  return;
}

Assistant:

void TracingServiceImpl::ScrapeSharedMemoryBuffers(
    TracingSession* tracing_session,
    ProducerEndpointImpl* producer) {
  if (!producer->smb_scraping_enabled_)
    return;

  // Can't copy chunks if we don't know about any trace writers.
  if (producer->writers_.empty())
    return;

  // Performance optimization: On flush or session disconnect, this method is
  // called for each producer. If the producer doesn't participate in the
  // session, there's no need to scape its chunks right now. We can tell if a
  // producer participates in the session by checking if the producer is allowed
  // to write into the session's log buffers.
  const auto& session_buffers = tracing_session->buffers_index;
  bool producer_in_session =
      std::any_of(session_buffers.begin(), session_buffers.end(),
                  [producer](BufferID buffer_id) {
                    return producer->allowed_target_buffers_.count(buffer_id);
                  });
  if (!producer_in_session)
    return;

  PERFETTO_DLOG("Scraping SMB for producer %" PRIu16, producer->id_);

  // Find and copy any uncommitted chunks from the SMB.
  //
  // In nominal conditions, the page layout of the used SMB pages should never
  // change because the service is the only one who is supposed to modify used
  // pages (to make them free again).
  //
  // However, the code here needs to deal with the case of a malicious producer
  // altering the SMB in unpredictable ways. Thankfully the SMB size is
  // immutable, so a chunk will always point to some valid memory, even if the
  // producer alters the intended layout and chunk header concurrently.
  // Ultimately a malicious producer altering the SMB's chunk layout while we
  // are iterating in this function is not any different from the case of a
  // malicious producer asking to commit a chunk made of random data, which is
  // something this class has to deal with regardless.
  //
  // The only legitimate mutations that can happen from sane producers,
  // concurrently to this function, are:
  //   A. free pages being partitioned,
  //   B. free chunks being migrated to kChunkBeingWritten,
  //   C. kChunkBeingWritten chunks being migrated to kChunkCompleted.

  SharedMemoryABI* abi = &producer->shmem_abi_;
  // num_pages() is immutable after the SMB is initialized and cannot be changed
  // even by a producer even if malicious.
  for (size_t page_idx = 0; page_idx < abi->num_pages(); page_idx++) {
    uint32_t layout = abi->GetPageLayout(page_idx);

    uint32_t used_chunks = abi->GetUsedChunks(layout);  // Returns a bitmap.
    // Skip empty pages.
    if (used_chunks == 0)
      continue;

    // Scrape the chunks that are currently used. These should be either in
    // state kChunkBeingWritten or kChunkComplete.
    for (uint32_t chunk_idx = 0; used_chunks; chunk_idx++, used_chunks >>= 1) {
      if (!(used_chunks & 1))
        continue;

      SharedMemoryABI::ChunkState state =
          SharedMemoryABI::GetChunkStateFromLayout(layout, chunk_idx);
      PERFETTO_DCHECK(state == SharedMemoryABI::kChunkBeingWritten ||
                      state == SharedMemoryABI::kChunkComplete);
      bool chunk_complete = state == SharedMemoryABI::kChunkComplete;

      SharedMemoryABI::Chunk chunk =
          abi->GetChunkUnchecked(page_idx, layout, chunk_idx);

      uint16_t packet_count;
      uint8_t flags;
      // GetPacketCountAndFlags has acquire_load semantics.
      std::tie(packet_count, flags) = chunk.GetPacketCountAndFlags();

      // It only makes sense to copy an incomplete chunk if there's at least
      // one full packet available. (The producer may not have completed the
      // last packet in it yet, so we need at least 2.)
      if (!chunk_complete && packet_count < 2)
        continue;

      // At this point, it is safe to access the remaining header fields of
      // the chunk. Even if the chunk was only just transferred from
      // kChunkFree into kChunkBeingWritten state, the header should be
      // written completely once the packet count increased above 1 (it was
      // reset to 0 by the service when the chunk was freed).

      WriterID writer_id = chunk.writer_id();
      base::Optional<BufferID> target_buffer_id =
          producer->buffer_id_for_writer(writer_id);

      // We can only scrape this chunk if we know which log buffer to copy it
      // into.
      if (!target_buffer_id)
        continue;

      // Skip chunks that don't belong to the requested tracing session.
      bool target_buffer_belongs_to_session =
          std::find(session_buffers.begin(), session_buffers.end(),
                    *target_buffer_id) != session_buffers.end();
      if (!target_buffer_belongs_to_session)
        continue;

      uint32_t chunk_id =
          chunk.header()->chunk_id.load(std::memory_order_relaxed);

      CopyProducerPageIntoLogBuffer(
          producer->id_, producer->uid_, producer->pid_, writer_id, chunk_id,
          *target_buffer_id, packet_count, flags, chunk_complete,
          chunk.payload_begin(), chunk.payload_size());
    }
  }
}